

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableWidgetItem::QTableWidgetItem(QTableWidgetItem *this,QTableWidgetItem *other)

{
  QTableWidgetItemPrivate *this_00;
  long in_RSI;
  QTableWidgetItem *in_RDI;
  QList<QWidgetItemData> *in_stack_ffffffffffffffd8;
  QList<QWidgetItemData> *in_stack_ffffffffffffffe0;
  
  in_RDI->_vptr_QTableWidgetItem = (_func_int **)&PTR__QTableWidgetItem_00d304b0;
  in_RDI->rtti = 0;
  QList<QWidgetItemData>::QList(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  in_RDI->view = (QTableWidget *)0x0;
  this_00 = (QTableWidgetItemPrivate *)operator_new(0x10);
  QTableWidgetItemPrivate::QTableWidgetItemPrivate(this_00,in_RDI);
  in_RDI->d = this_00;
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = *(Int *)(in_RSI + 0x38);
  return;
}

Assistant:

QTableWidgetItem::QTableWidgetItem(const QTableWidgetItem &other)
    : rtti(Type), values(other.values), view(nullptr),
      d(new QTableWidgetItemPrivate(this)),
      itemFlags(other.itemFlags)
{
}